

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O1

void test_open_address_hashmap_simple_insert_and_query(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_status_t iVar3;
  char *expected;
  ulong uVar4;
  char str [10];
  ion_hashmap_t map;
  uint local_78;
  char local_72 [10];
  ion_hashmap_t local_68;
  
  local_68.super.key_type = key_type_numeric_signed;
  local_68.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_68,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  local_78 = 0;
  if (0 < local_68.map_size) {
    uVar4 = 0;
    do {
      sprintf(local_72,"%02i is key",uVar4);
      iVar3 = oah_insert(&local_68,&local_78,local_72);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x14c,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00101dd8;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x14d,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00101dd8;
      local_78 = local_78 + 1;
      uVar4 = (ulong)local_78;
    } while ((int)local_78 < local_68.map_size);
  }
  expected = (char *)malloc(10);
  local_78 = 0;
  if (0 < local_68.map_size) {
    do {
      iVar3 = oah_get(&local_68,&local_78,expected);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar3.error == '\0'),0x156,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00101dd8;
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x157,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') goto LAB_00101dd8;
      sprintf(local_72,"%02i is key",(ulong)local_78);
      pVar1 = planck_unit_assert_str_are_equal
                        (tc,expected,local_72,0x15d,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                        );
      if (pVar1 == '\0') goto LAB_00101dd8;
      local_78 = local_78 + 1;
    } while ((int)local_78 < local_68.map_size);
  }
  if (expected != (char *)0x0) {
    free(expected);
  }
  iVar2 = oah_destroy(&local_68);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2 == '\0'),0x165,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    return;
  }
LAB_00101dd8:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_insert_and_query(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	for (i = 0; i < map.map_size; i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		/* this is will wrap the map */
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	ion_value_t value;

	value = malloc(10);

	for (i = 0; i < map.map_size; i++) {
		status = oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);
	}

	/* must free value after query */
	if (value != NULL) {
		free(value);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}